

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::AnnotatedHandler::decode
          (AnnotatedHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  Reader value;
  Reader value_00;
  Reader *pRVar1;
  RemoveConst<capnp::json::Value::Field::Reader> *pRVar2;
  RemoveConst<capnp::json::Value::Field::Reader> *pRVar3;
  SegmentReader *pSVar4;
  CapTableReader *pCVar5;
  undefined4 uVar6;
  bool bVar7;
  Reader *__begin3;
  SegmentReader *pSVar8;
  StringPtr SVar9;
  Reader field;
  HashSet<const_void_*> unionsSeen;
  Reader field_1;
  ArrayBuilder<capnp::json::Value::Field::Reader> local_188;
  AnnotatedHandler *local_168;
  JsonCodec *local_160;
  IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
  local_158;
  Reader local_148;
  HashSet<const_void_*> local_118;
  undefined1 local_c8 [40];
  Arena *pAStack_a0;
  Reader local_90;
  Reader local_60;
  
  local_168 = this;
  local_160 = codec;
  if ((input._reader.dataSize < 0x10) || (*input._reader.data != 5)) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&local_118,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x463,FAILED,"input.isObject()","");
    kj::_::Debug::Fault::fatal((Fault *)&local_118);
  }
  local_118.
  super_Table<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry,_kj::HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>_>
  .rows.builder.endPtr = (Entry *)0x0;
  local_118.
  super_Table<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry,_kj::HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>_>
  .rows.builder.ptr = (Entry *)0x0;
  local_118.
  super_Table<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry,_kj::HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>_>
  .rows.builder.pos =
       (RemoveConst<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry> *)
       0x0;
  local_118.
  super_Table<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry,_kj::HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>_>
  .indexes.erasedCount = 0;
  local_118.
  super_Table<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry,_kj::HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>_>
  .indexes.buckets.ptr = (HashBucket *)0x0;
  local_118.
  super_Table<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry,_kj::HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>_>
  .indexes.buckets.size_ = 0;
  local_118.
  super_Table<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry,_kj::HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>_>
  .indexes.buckets.disposer = (ArrayDisposer *)0x0;
  local_188.ptr = (Reader *)0x0;
  local_188.pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
  local_188.endPtr = (Reader *)0x0;
  json::Value::Reader::getObject((Reader *)local_c8,&input);
  uVar6 = local_c8._24_4_;
  local_158.container = (Reader *)local_c8;
  for (local_158.index = 0; local_158.index != uVar6; local_158.index = local_158.index + 1) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
    ::operator*(&local_148,&local_158);
    SVar9.content = (ArrayPtr<const_char>)json::Value::Field::Reader::getName(&local_148);
    json::Value::Field::Reader::getValue(&local_60,&local_148);
    value._reader.capTable = local_60._reader.capTable;
    value._reader.segment = local_60._reader.segment;
    value._reader.data = local_60._reader.data;
    value._reader.pointers = local_60._reader.pointers;
    value._reader.dataSize = local_60._reader.dataSize;
    value._reader.pointerCount = local_60._reader.pointerCount;
    value._reader._38_2_ = local_60._reader._38_2_;
    value._reader.nestingLimit = local_60._reader.nestingLimit;
    value._reader._44_4_ = local_60._reader._44_4_;
    bVar7 = decodeField(local_168,local_160,SVar9,value,output,&local_118);
    if (!bVar7) {
      kj::Vector<capnp::json::Value::Field::Reader>::add<capnp::json::Value::Field::Reader&>
                ((Vector<capnp::json::Value::Field::Reader> *)&local_188,&local_148);
    }
  }
  do {
    pRVar2 = local_188.pos;
    pSVar8 = (SegmentReader *)local_188.ptr;
    if (local_188.pos == local_188.ptr) break;
    local_148._reader.segment = (SegmentReader *)local_188.ptr;
    local_148._reader.capTable = (CapTableReader *)local_188.pos;
    local_148._reader.data = local_188.endPtr;
    local_148._reader.pointers = (WirePointer *)local_188.disposer;
    local_188.ptr = (Reader *)0x0;
    local_188.pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
    local_188.endPtr = (Reader *)0x0;
    for (; pCVar5 = local_148._reader.capTable, pSVar4 = local_148._reader.segment,
        pRVar3 = local_188.pos, pRVar1 = local_188.ptr, pSVar8 != (SegmentReader *)pRVar2;
        pSVar8 = (SegmentReader *)&pSVar8[1].id) {
      local_c8._0_8_ = pSVar8->arena;
      local_c8._8_8_ = *(undefined8 *)&pSVar8->id;
      local_c8._16_8_ = (pSVar8->ptr).ptr;
      local_c8._24_8_ = (pSVar8->ptr).size_;
      local_c8._32_8_ = pSVar8->readLimiter;
      pAStack_a0 = pSVar8[1].arena;
      SVar9.content = (ArrayPtr<const_char>)json::Value::Field::Reader::getName((Reader *)local_c8);
      json::Value::Field::Reader::getValue(&local_90,(Reader *)local_c8);
      value_00._reader.capTable = local_90._reader.capTable;
      value_00._reader.segment = local_90._reader.segment;
      value_00._reader.data = local_90._reader.data;
      value_00._reader.pointers = local_90._reader.pointers;
      value_00._reader.dataSize = local_90._reader.dataSize;
      value_00._reader.pointerCount = local_90._reader.pointerCount;
      value_00._reader._38_2_ = local_90._reader._38_2_;
      value_00._reader.nestingLimit = local_90._reader.nestingLimit;
      value_00._reader._44_4_ = local_90._reader._44_4_;
      bVar7 = decodeField(local_168,local_160,SVar9,value_00,output,&local_118);
      if (!bVar7) {
        kj::Vector<capnp::json::Value::Field::Reader>::add<capnp::json::Value::Field::Reader&>
                  ((Vector<capnp::json::Value::Field::Reader> *)&local_188,(Reader *)local_c8);
      }
    }
    kj::ArrayBuilder<capnp::json::Value::Field::Reader>::dispose
              ((ArrayBuilder<capnp::json::Value::Field::Reader> *)&local_148);
  } while ((long)pRVar3 - (long)pRVar1 != (long)pCVar5 - (long)pSVar4);
  kj::ArrayBuilder<capnp::json::Value::Field::Reader>::dispose(&local_188);
  kj::Table<const_void_*,_kj::HashIndex<kj::_::HashSetCallbacks>_>::~Table
            ((Table<const_void_*,_kj::HashIndex<kj::_::HashSetCallbacks>_> *)&local_118);
  return;
}

Assistant:

void decode(const JsonCodec& codec, JsonValue::Reader input,
              DynamicStruct::Builder output) const override {
    KJ_REQUIRE(input.isObject());
    kj::HashSet<const void*> unionsSeen;
    kj::Vector<JsonValue::Field::Reader> retries;
    for (auto field: input.getObject()) {
      if (!decodeField(codec, field.getName(), field.getValue(), output, unionsSeen)) {
        retries.add(field);
      }
    }
    while (!retries.empty()) {
      auto retriesCopy = kj::mv(retries);
      KJ_ASSERT(retries.empty());
      for (auto field: retriesCopy) {
        if (!decodeField(codec, field.getName(), field.getValue(), output, unionsSeen)) {
          retries.add(field);
        }
      }
      if (retries.size() == retriesCopy.size()) {
        // We made no progress in this iteration. Give up on the remaining fields.
        break;
      }
    }
  }